

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_connection.c
# Opt level: O0

apx_error_t
apx_clientConnection_tcp_connect(apx_clientSocketConnection_t *self,char *address,uint16_t port)

{
  int8_t iVar1;
  msocket_t *socket_object;
  int8_t result;
  msocket_t *socketObject;
  apx_error_t retval;
  uint16_t port_local;
  char *address_local;
  apx_clientSocketConnection_t *self_local;
  
  if (self == (apx_clientSocketConnection_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    socketObject._0_4_ = 0;
    socket_object = msocket_new('\x02');
    if (socket_object == (msocket_t *)0x0) {
      socketObject._0_4_ = 2;
    }
    else {
      register_msocket_handler(self,socket_object);
      iVar1 = msocket_connect(socket_object,address,port);
      if (iVar1 != '\0') {
        msocket_delete(socket_object);
        self->socket_object = (msocket_t *)0x0;
        socketObject._0_4_ = 0x22;
      }
    }
    self_local._4_4_ = (apx_error_t)socketObject;
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_clientConnection_tcp_connect(apx_clientSocketConnection_t *self, const char *address, uint16_t port)
{
   if (self != 0)
   {
      apx_error_t retval = APX_NO_ERROR;
      msocket_t *socketObject = msocket_new(AF_INET);
      if (socketObject != 0)
      {
         int8_t result = 0;
         register_msocket_handler(self, socketObject);
         result = msocket_connect(socketObject, address, port);
         if (result != 0)
         {
            msocket_delete(socketObject);
            self->socket_object = (SOCKET_TYPE*) 0;
            retval = APX_CONNECTION_ERROR;
         }
         else
         {

         }
      }
      else
      {
         retval = APX_MEM_ERROR;
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}